

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc.cpp
# Opt level: O2

string * get_libc_version_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  __s = (char *)gnu_get_libc_version();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,__s,&local_111);
  std::operator+(&local_b0,"GCC: runtime ",&local_d0);
  std::operator+(&local_90,&local_b0,", compile-time ");
  std::__cxx11::to_string(&local_f0,2);
  std::operator+(&local_70,&local_90,&local_f0);
  std::operator+(&local_50,&local_70,".");
  std::__cxx11::to_string(&local_110,0x23);
  std::operator+(&local_30,&local_50,&local_110);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  return in_RDI;
}

Assistant:

std::string get_libc_version(){

std::string v;

#if defined(__UCLIBC__)
v = "uClibc: " + std::string(__UCLIBC__);
#elif defined(__GLIBC__)
v = "GCC: runtime " + std::string(gnu_get_libc_version()) + ", compile-time " + std::to_string(__GLIBC__) + "." + std::to_string(__GLIBC_MINOR__);
#elif defined(__apple_build_version__)
v = "Apple";
#elif defined(_MSC_VER)
v = "Microsoft " + std::to_string(_MSC_VER);
#endif

return v;
}